

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_tuv(REF_GEOM ref_geom,REF_INT node,REF_INT type,REF_INT id,REF_DBL *param)

{
  REF_DBL *pRVar1;
  uint uVar2;
  long lVar3;
  undefined8 uVar4;
  long lVar5;
  char *pcVar6;
  REF_INT geom;
  int local_24;
  
  uVar2 = ref_geom_find(ref_geom,node,type,id,&local_24);
  if (uVar2 == 0) {
    lVar3 = (long)local_24;
    lVar5 = (long)ref_geom->descr[lVar3 * 6 + 3];
    if (lVar5 == 0) {
      lVar5 = (long)ref_geom->descr[lVar3 * 6 + 4];
      if (lVar5 == 0) {
        if (type < 1) {
          return 0;
        }
        pRVar1 = ref_geom->param;
        *param = pRVar1[lVar3 * 2];
        if (type == 1) {
          return 0;
        }
        param[1] = pRVar1[(int)(local_24 * 2 | 1)];
        return 0;
      }
      pcVar6 = "use ref_geom_cell_tuv for degen";
      uVar4 = 0x2b3;
    }
    else {
      pcVar6 = "use ref_geom_cell_tuv for jumps";
      uVar4 = 0x2b2;
    }
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar4,
           "ref_geom_tuv",pcVar6,0,lVar5);
    uVar2 = 1;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x2b0,
           "ref_geom_tuv",(ulong)uVar2,"not found");
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tuv(REF_GEOM ref_geom, REF_INT node, REF_INT type,
                                REF_INT id, REF_DBL *param) {
  REF_INT geom;

  RSS(ref_geom_find(ref_geom, node, type, id, &geom), "not found");

  REIS(0, ref_geom_jump(ref_geom, geom), "use ref_geom_cell_tuv for jumps");
  REIS(0, ref_geom_degen(ref_geom, geom), "use ref_geom_cell_tuv for degen");

  if (type > 0) param[0] = ref_geom_param(ref_geom, 0, geom);
  if (type > 1) param[1] = ref_geom_param(ref_geom, 1, geom);

  return REF_SUCCESS;
}